

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  uint8_t uVar1;
  void **ppvVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  int iVar5;
  uint64_t uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  run_container_t *run;
  long lVar11;
  uint8_t uVar12;
  run_container_t *prVar13;
  min_max_sum_t mms;
  undefined8 local_40;
  uint64_t local_38;
  
  stat->sum_value = 0;
  stat->cardinality = 0;
  stat->n_bytes_run_containers = 0;
  stat->n_bytes_bitset_containers = 0;
  stat->max_value = 0;
  stat->min_value = 0;
  stat->n_values_array_containers = 0;
  stat->n_values_run_containers = 0;
  stat->n_values_bitset_containers = 0;
  stat->n_bytes_array_containers = 0;
  stat->n_containers = 0;
  stat->n_array_containers = 0;
  stat->n_run_containers = 0;
  stat->n_bitset_containers = 0;
  stat->n_containers = (r->high_low_container).size;
  uVar6 = roaring_bitmap_get_cardinality(r);
  stat->cardinality = uVar6;
  local_40 = 0xffffffff;
  local_38 = 0;
  roaring_iterate(r,min_max_sum_fnc,&local_40);
  stat->min_value = (uint32_t)local_40;
  stat->max_value = local_40._4_4_;
  stat->sum_value = local_38;
  lVar11 = (long)(r->high_low_container).size;
  if (0 < lVar11) {
    ppvVar2 = (r->high_low_container).containers;
    puVar3 = (r->high_low_container).typecodes;
    lVar9 = 0;
    do {
      prVar13 = (run_container_t *)ppvVar2[lVar9];
      uVar12 = puVar3[lVar9];
      run = prVar13;
      uVar4 = uVar12;
      uVar1 = uVar12;
      if (uVar12 == '\x04') {
        uVar1 = *(uint8_t *)&prVar13->runs;
        uVar4 = *(uint8_t *)&prVar13->runs;
        if (uVar4 == '\x04') goto LAB_0011371a;
        run = *(run_container_t **)prVar13;
      }
      if (uVar4 == '\x03') {
        lVar8 = cpuid_Extended_Feature_Enumeration_info(7);
        if ((*(uint *)(lVar8 + 4) & 0x20) == 0) {
          iVar5 = run->n_runs;
          lVar8 = (long)iVar5;
          if (0 < lVar8) {
            lVar10 = 0;
            do {
              iVar5 = iVar5 + (uint)run->runs[lVar10].length;
              lVar10 = lVar10 + 1;
            } while (lVar8 != lVar10);
          }
        }
        else {
          iVar5 = _avx2_run_container_cardinality(run);
        }
      }
      else {
        if ((uVar4 != '\x02') && (uVar4 != '\x01')) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
        }
        iVar5 = run->n_runs;
      }
      if (uVar12 == '\x04') {
        uVar12 = *(uint8_t *)&prVar13->runs;
        if (uVar12 == '\x04') {
LAB_0011371a:
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        prVar13 = *(run_container_t **)prVar13;
      }
      if (uVar12 == '\x01') {
        iVar7 = 0x2000;
      }
      else if (uVar12 == '\x03') {
        iVar7 = prVar13->n_runs * 4 + 2;
      }
      else {
        if (uVar12 != '\x02') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x11a5,"int32_t container_size_in_bytes(const container_t *, uint8_t)");
        }
        iVar7 = prVar13->n_runs * 2;
      }
      if (uVar1 == '\x03') {
        stat->n_run_containers = stat->n_run_containers + 1;
        stat->n_values_run_containers = stat->n_values_run_containers + iVar5;
        stat->n_bytes_run_containers = stat->n_bytes_run_containers + iVar7;
      }
      else if (uVar1 == '\x02') {
        stat->n_array_containers = stat->n_array_containers + 1;
        stat->n_values_array_containers = stat->n_values_array_containers + iVar5;
        stat->n_bytes_array_containers = stat->n_bytes_array_containers + iVar7;
      }
      else {
        if (uVar1 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x3be7,
                        "void roaring_bitmap_statistics(const roaring_bitmap_t *, roaring_statistics_t *)"
                       );
        }
        stat->n_bitset_containers = stat->n_bitset_containers + 1;
        stat->n_values_bitset_containers = stat->n_values_bitset_containers + iVar5;
        stat->n_bytes_bitset_containers = stat->n_bytes_bitset_containers + iVar7;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar11);
  }
  return;
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->cardinality = roaring_bitmap_get_cardinality(r);
    min_max_sum_t mms;
    mms.min = UINT32_C(0xFFFFFFFF);
    mms.max = UINT32_C(0);
    mms.sum = 0;
    roaring_iterate(r, &min_max_sum_fnc, &mms);
    stat->min_value = mms.min;
    stat->max_value = mms.max;
    stat->sum_value = mms.sum;

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                __builtin_unreachable();
        }
    }
}